

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithMapBufferFlushCase::testWithBufferSize
          (ModifyAfterWithMapBufferFlushCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
          *result,int bufferSize)

{
  char cVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  reference src;
  deUint64 dVar4;
  deUint64 dVar5;
  UnmapFailureError *this_01;
  deInt32 local_b8;
  deInt32 local_b4;
  GLboolean unmapSucceeded;
  deUint64 endTime_2;
  deUint64 startTime_2;
  deUint64 endTime_1;
  deUint64 startTime_1;
  allocator<char> local_69;
  string local_68;
  deUint64 local_48;
  deUint64 endTime;
  deUint64 startTime;
  void *mapPtr;
  int subdataSize;
  int subdataOffset;
  Functions *gl;
  UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  *pUStack_18;
  int bufferSize_local;
  UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  *result_local;
  ModifyAfterWithMapBufferFlushCase *this_local;
  
  gl._4_4_ = bufferSize;
  pUStack_18 = result;
  result_local = (UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                  *)this;
  pRVar3 = gles3::Context::getRenderContext
                     ((this->
                      super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                      ).
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                      .super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _subdataSize = CONCAT44(extraout_var,iVar2);
  if ((this->m_partialUpload & 1U) == 0) {
    local_b4 = 0;
  }
  else {
    local_b4 = gl._4_4_ / 4;
  }
  mapPtr._4_4_ = deAlign32(local_b4,0x10);
  if ((this->m_partialUpload & 1U) == 0) {
    local_b8 = gl._4_4_;
  }
  else {
    local_b8 = gl._4_4_ / 2;
  }
  mapPtr._0_4_ = deAlign32(local_b8,0x10);
  endTime = deGetMicroseconds();
  startTime = (**(code **)(_subdataSize + 0xd00))
                        (0x8892,(long)mapPtr._4_4_,(long)(deInt32)mapPtr,this->m_mapFlags);
  local_48 = deGetMicroseconds();
  dVar4 = startTime;
  if (startTime == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"mapBufferRange returned null",&local_69);
    tcu::TestError::TestError(this_00,&local_68);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (pUStack_18->duration).mapDuration = local_48 - endTime;
  src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  (&(this->
                    super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                    ).m_zeroData,0);
  dVar4 = medianTimeMemcpy((void *)dVar4,src,(deInt32)mapPtr);
  (pUStack_18->duration).writeDuration = dVar4;
  dVar4 = deGetMicroseconds();
  (**(code **)(_subdataSize + 0x658))(0x8892,0,(long)(deInt32)mapPtr);
  dVar5 = deGetMicroseconds();
  (pUStack_18->duration).flushDuration = dVar5 - dVar4;
  dVar4 = deGetMicroseconds();
  cVar1 = (**(code **)(_subdataSize + 0x1670))(0x8892);
  dVar5 = deGetMicroseconds();
  if (cVar1 != '\x01') {
    this_01 = (UnmapFailureError *)__cxa_allocate_exception(8);
    UnmapFailureError::UnmapFailureError(this_01);
    __cxa_throw(this_01,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                UnmapFailureError::~UnmapFailureError);
  }
  (pUStack_18->duration).unmapDuration = dVar5 - dVar4;
  (pUStack_18->duration).totalDuration =
       (pUStack_18->duration).mapDuration + (pUStack_18->duration).writeDuration +
       (pUStack_18->duration).unmapDuration + (pUStack_18->duration).flushDuration;
  (pUStack_18->duration).fitResponseDuration = (pUStack_18->duration).totalDuration;
  pUStack_18->writtenSize = (deInt32)mapPtr;
  return;
}

Assistant:

void ModifyAfterWithMapBufferFlushCase::testWithBufferSize (UploadSampleResult<MapBufferRangeFlushDurationNoAlloc>& result, int bufferSize)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	const int					subdataOffset		= deAlign32((m_partialUpload) ? (bufferSize / 4) : (0), 4*4);
	const int					subdataSize			= deAlign32((m_partialUpload) ? (bufferSize / 2) : (bufferSize), 4*4);
	void*						mapPtr;

	// map
	{
		deUint64 startTime;
		deUint64 endTime;

		startTime = deGetMicroseconds();
		mapPtr = gl.mapBufferRange(GL_ARRAY_BUFFER, subdataOffset, subdataSize, m_mapFlags);
		endTime = deGetMicroseconds();

		if (!mapPtr)
			throw tcu::TestError("mapBufferRange returned null");

		result.duration.mapDuration = endTime - startTime;
	}

	// write
	{
		result.duration.writeDuration = medianTimeMemcpy(mapPtr, &m_zeroData[0], subdataSize);
	}

	// flush
	{
		deUint64 startTime;
		deUint64 endTime;

		startTime = deGetMicroseconds();
		gl.flushMappedBufferRange(GL_ARRAY_BUFFER, 0, subdataSize);
		endTime = deGetMicroseconds();

		result.duration.flushDuration = endTime - startTime;
	}

	// unmap
	{
		deUint64		startTime;
		deUint64		endTime;
		glw::GLboolean	unmapSucceeded;

		startTime = deGetMicroseconds();
		unmapSucceeded = gl.unmapBuffer(GL_ARRAY_BUFFER);
		endTime = deGetMicroseconds();

		if (unmapSucceeded != GL_TRUE)
			throw UnmapFailureError();

		result.duration.unmapDuration = endTime - startTime;
	}

	result.duration.totalDuration = result.duration.mapDuration + result.duration.writeDuration + result.duration.unmapDuration + result.duration.flushDuration;
	result.duration.fitResponseDuration = result.duration.totalDuration;
	result.writtenSize = subdataSize;
}